

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_codec.c
# Opt level: O2

int frame_codec_receive_bytes(FRAME_CODEC_HANDLE frame_codec,uchar *buffer,size_t size)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  LIST_ITEM_HANDLE item_handle;
  SUBSCRIPTION *pSVar5;
  uchar *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  byte *pbVar11;
  
  if (size == 0 || (buffer == (uchar *)0x0 || frame_codec == (FRAME_CODEC_HANDLE)0x0)) {
    p_Var4 = xlogging_get_log_function();
    iVar3 = 0xc3;
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                ,"frame_codec_receive_bytes",0xc2,1,
                "Bad arguments: frame_codec = %p, buffer = %p, size = %u",frame_codec,buffer,size);
      iVar3 = 0xc3;
    }
  }
  else {
    iVar3 = 0xb6;
LAB_0016498d:
    uVar8 = size;
    if (uVar8 != 0) {
      switch(frame_codec->receive_frame_state) {
      case RECEIVE_FRAME_STATE_FRAME_SIZE:
        uVar2 = ((uint)*buffer << ((char)frame_codec->receive_frame_pos * -8 + 0x18U & 0x1f)) +
                frame_codec->receive_frame_size;
        frame_codec->receive_frame_size = uVar2;
        buffer = buffer + 1;
        size = uVar8 - 1;
        sVar10 = frame_codec->receive_frame_pos + 1;
        frame_codec->receive_frame_pos = sVar10;
        iVar3 = 0;
        if (sVar10 == 4) {
          if ((uVar2 < 8) || (frame_codec->max_frame_size < uVar2)) {
            frame_codec->receive_frame_state = RECEIVE_FRAME_STATE_ERROR;
            (*frame_codec->on_frame_codec_error)(frame_codec->on_frame_codec_error_callback_context)
            ;
            p_Var4 = xlogging_get_log_function();
            iVar3 = 0xe7;
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                        ,"frame_codec_receive_bytes",0xe6,1,"Received frame size is too big");
              iVar3 = 0xe7;
            }
          }
          else {
            frame_codec->receive_frame_state = RECEIVE_FRAME_STATE_DOFF;
          }
        }
        goto LAB_0016498d;
      case RECEIVE_FRAME_STATE_DOFF:
        bVar1 = *buffer;
        frame_codec->receive_frame_doff = bVar1;
        pbVar11 = buffer + 1;
        if (bVar1 < 2) {
          frame_codec->receive_frame_state = RECEIVE_FRAME_STATE_ERROR;
          (*frame_codec->on_frame_codec_error)(frame_codec->on_frame_codec_error_callback_context);
          p_Var4 = xlogging_get_log_function();
          iVar3 = 0x108;
          size = uVar8 - 1;
          buffer = pbVar11;
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                      ,"frame_codec_receive_bytes",0x107,1,"Malformed frame received");
            iVar3 = 0x108;
          }
          goto LAB_0016498d;
        }
        frame_codec->receive_frame_state = RECEIVE_FRAME_STATE_FRAME_TYPE;
        break;
      case RECEIVE_FRAME_STATE_FRAME_TYPE:
        frame_codec->type_specific_size = (uint)frame_codec->receive_frame_doff * 4 - 6;
        frame_codec->receive_frame_type = *buffer;
        pbVar11 = buffer + 1;
        item_handle = singlylinkedlist_find
                                (frame_codec->subscription_list,find_subscription_by_frame_type,
                                 &frame_codec->receive_frame_type);
        if (item_handle == (LIST_ITEM_HANDLE)0x0) {
          frame_codec->receive_frame_subscription = (SUBSCRIPTION *)0x0;
        }
        else {
          pSVar5 = (SUBSCRIPTION *)singlylinkedlist_item_get_value(item_handle);
          frame_codec->receive_frame_subscription = pSVar5;
          if (pSVar5 != (SUBSCRIPTION *)0x0) {
            frame_codec->receive_frame_pos = 0;
            uVar2 = frame_codec->receive_frame_size - 6;
            frame_codec->receive_frame_malloc_size = uVar2;
            puVar6 = (uchar *)malloc((ulong)uVar2);
            frame_codec->receive_frame_bytes = puVar6;
            if (puVar6 == (uchar *)0x0) {
              frame_codec->receive_frame_state = RECEIVE_FRAME_STATE_ERROR;
              (*frame_codec->on_frame_codec_error)
                        (frame_codec->on_frame_codec_error_callback_context);
              p_Var4 = xlogging_get_log_function();
              iVar3 = 0x140;
              size = uVar8 - 1;
              buffer = pbVar11;
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                          ,"frame_codec_receive_bytes",0x13f,1,
                          "Cannot allocate memory for frame bytes");
                iVar3 = 0x140;
              }
              goto LAB_0016498d;
            }
          }
        }
        frame_codec->receive_frame_state = RECEIVE_FRAME_STATE_TYPE_SPECIFIC;
        break;
      case RECEIVE_FRAME_STATE_TYPE_SPECIFIC:
        uVar7 = (ulong)frame_codec->type_specific_size;
        sVar10 = frame_codec->receive_frame_pos;
        uVar9 = uVar7 - sVar10;
        if (uVar8 <= uVar7 - sVar10) {
          uVar9 = uVar8;
        }
        if (frame_codec->receive_frame_subscription != (SUBSCRIPTION *)0x0) {
          if (frame_codec->receive_frame_bytes == (uchar *)0x0) {
            p_Var4 = xlogging_get_log_function();
            iVar3 = 0x15b;
            size = 0;
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
                        ,"frame_codec_receive_bytes",0x15a,1,"Frame bytes memory was not allocated")
              ;
              iVar3 = 0x15b;
              size = 0;
            }
            goto LAB_0016498d;
          }
          iVar3 = 0x161;
          size = 0;
          if ((ulong)frame_codec->receive_frame_malloc_size < sVar10 + uVar9) goto LAB_0016498d;
          memcpy(frame_codec->receive_frame_bytes + sVar10,buffer,uVar9);
          sVar10 = frame_codec->receive_frame_pos;
          uVar7 = (ulong)frame_codec->type_specific_size;
        }
        frame_codec->receive_frame_pos = sVar10 + uVar9;
        buffer = buffer + uVar9;
        iVar3 = 0;
        size = uVar8 - uVar9;
        if (sVar10 + uVar9 == uVar7) {
          if (frame_codec->receive_frame_size == 8) {
            pSVar5 = frame_codec->receive_frame_subscription;
            if (pSVar5 != (SUBSCRIPTION *)0x0) {
              (*pSVar5->on_frame_received)
                        (pSVar5->callback_context,frame_codec->receive_frame_bytes,(uint32_t)uVar7,
                         (uchar *)0x0,0);
              free(frame_codec->receive_frame_bytes);
              frame_codec->receive_frame_bytes = (uchar *)0x0;
            }
            frame_codec->receive_frame_state = RECEIVE_FRAME_STATE_FRAME_SIZE;
            frame_codec->receive_frame_size = 0;
          }
          else {
            frame_codec->receive_frame_state = RECEIVE_FRAME_STATE_FRAME_BODY;
          }
          iVar3 = 0;
          frame_codec->receive_frame_pos = 0;
        }
        goto LAB_0016498d;
      case RECEIVE_FRAME_STATE_FRAME_BODY:
        iVar3 = 0x19c;
        size = 0;
        if (frame_codec->receive_frame_bytes != (uchar *)0x0) {
          uVar2 = frame_codec->receive_frame_size + (uint)frame_codec->receive_frame_doff * -4;
          uVar9 = (ulong)uVar2 - frame_codec->receive_frame_pos;
          if (uVar8 <= uVar9) {
            uVar9 = uVar8;
          }
          memcpy(frame_codec->receive_frame_bytes +
                 (ulong)frame_codec->type_specific_size + frame_codec->receive_frame_pos,buffer,
                 uVar9);
          buffer = buffer + uVar9;
          sVar10 = uVar9 + frame_codec->receive_frame_pos;
          frame_codec->receive_frame_pos = sVar10;
          iVar3 = 0;
          size = uVar8 - uVar9;
          if (sVar10 == uVar2) {
            pSVar5 = frame_codec->receive_frame_subscription;
            if (pSVar5 != (SUBSCRIPTION *)0x0) {
              (*pSVar5->on_frame_received)
                        (pSVar5->callback_context,frame_codec->receive_frame_bytes,
                         frame_codec->type_specific_size,
                         frame_codec->receive_frame_bytes + frame_codec->type_specific_size,uVar2);
              free(frame_codec->receive_frame_bytes);
              frame_codec->receive_frame_bytes = (uchar *)0x0;
            }
            iVar3 = 0;
            frame_codec->receive_frame_state = RECEIVE_FRAME_STATE_FRAME_SIZE;
            frame_codec->receive_frame_pos = 0;
            frame_codec->receive_frame_size = 0;
          }
        }
        goto LAB_0016498d;
      default:
        goto switchD_001649b0_default;
      }
      iVar3 = 0;
      size = uVar8 - 1;
      buffer = buffer + 1;
      goto LAB_0016498d;
    }
  }
  return iVar3;
switchD_001649b0_default:
  p_Var4 = xlogging_get_log_function();
  iVar3 = 0xcf;
  size = 0;
  if (p_Var4 != (LOGGER_LOG)0x0) {
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/frame_codec.c"
              ,"frame_codec_receive_bytes",0xce,1,"Frame codec is in error state");
    iVar3 = 0xcf;
    size = 0;
  }
  goto LAB_0016498d;
}

Assistant:

int frame_codec_receive_bytes(FRAME_CODEC_HANDLE frame_codec, const unsigned char* buffer, size_t size)
{
    int result = MU_FAILURE;
    FRAME_CODEC_INSTANCE* frame_codec_data = (FRAME_CODEC_INSTANCE*)frame_codec;

    /* Codes_SRS_FRAME_CODEC_01_026: [If frame_codec or buffer are NULL, frame_codec_receive_bytes shall return a non-zero value.] */
    if ((frame_codec == NULL) ||
        (buffer == NULL) ||
        /* Codes_SRS_FRAME_CODEC_01_027: [If size is zero, frame_codec_receive_bytes shall return a non-zero value.] */
        (size == 0))
    {
        LogError("Bad arguments: frame_codec = %p, buffer = %p, size = %u",
            frame_codec,
            buffer,
            (unsigned int)size);
        result = MU_FAILURE;
    }
    else
    {
        while (size > 0)
        {
            switch (frame_codec_data->receive_frame_state)
            {
            default:
            case RECEIVE_FRAME_STATE_ERROR:
                /* Codes_SRS_FRAME_CODEC_01_074: [If a decoding error is detected, any subsequent calls on frame_codec_data_receive_bytes shall fail.] */
                LogError("Frame codec is in error state");
                result = MU_FAILURE;
                size = 0;
                break;

                /* Codes_SRS_FRAME_CODEC_01_008: [SIZE Bytes 0-3 of the frame header contain the frame size.] */
            case RECEIVE_FRAME_STATE_FRAME_SIZE:
                /* Codes_SRS_FRAME_CODEC_01_009: [This is an unsigned 32-bit integer that MUST contain the total frame size of the frame header, extended header, and frame body.] */
                frame_codec_data->receive_frame_size += buffer[0] << (24 - frame_codec_data->receive_frame_pos * 8);
                buffer++;
                size--;
                frame_codec_data->receive_frame_pos++;

                if (frame_codec_data->receive_frame_pos == 4)
                {
                    /* Codes_SRS_FRAME_CODEC_01_010: [The frame is malformed if the size is less than the size of the frame header (8 bytes).] */
                    if ((frame_codec_data->receive_frame_size < FRAME_HEADER_SIZE) ||
                        /* Codes_SRS_FRAME_CODEC_01_096: [If a frame bigger than the current max frame size is received, frame_codec_receive_bytes shall fail and return a non-zero value.] */
                        (frame_codec_data->receive_frame_size > frame_codec_data->max_frame_size))
                    {
                        /* Codes_SRS_FRAME_CODEC_01_074: [If a decoding error is detected, any subsequent calls on frame_codec_data_receive_bytes shall fail.] */
                        frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_ERROR;
                        /* Codes_SRS_FRAME_CODEC_01_103: [Upon any decode error, if an error callback has been passed to frame_codec_create, then the error callback shall be called with the context argument being the on_frame_codec_error_callback_context argument passed to frame_codec_create.] */
                        frame_codec_data->on_frame_codec_error(frame_codec_data->on_frame_codec_error_callback_context);
                        LogError("Received frame size is too big");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_DOFF;
                        result = 0;
                    }
                }
                else
                {
                    result = 0;
                }

                break;

            case RECEIVE_FRAME_STATE_DOFF:
                /* Codes_SRS_FRAME_CODEC_01_011: [DOFF Byte 4 of the frame header is the data offset.] */
                /* Codes_SRS_FRAME_CODEC_01_013: [The value of the data offset is an unsigned, 8-bit integer specifying a count of 4-byte words.] */
                /* Codes_SRS_FRAME_CODEC_01_012: [This gives the position of the body within the frame.] */
                frame_codec_data->receive_frame_doff = buffer[0];
                buffer++;
                size--;

                /* Codes_SRS_FRAME_CODEC_01_014: [Due to the mandatory 8-byte frame header, the frame is malformed if the value is less than 2.] */
                if (frame_codec_data->receive_frame_doff < 2)
                {
                    /* Codes_SRS_FRAME_CODEC_01_074: [If a decoding error is detected, any subsequent calls on frame_codec_data_receive_bytes shall fail.] */
                    frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_ERROR;

                    /* Codes_SRS_FRAME_CODEC_01_103: [Upon any decode error, if an error callback has been passed to frame_codec_create, then the error callback shall be called with the context argument being the on_frame_codec_error_callback_context argument passed to frame_codec_create.] */
                    frame_codec_data->on_frame_codec_error(frame_codec_data->on_frame_codec_error_callback_context);

                    LogError("Malformed frame received");
                    result = MU_FAILURE;
                }
                else
                {
                    frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_FRAME_TYPE;
                    result = 0;
                }

                break;

            case RECEIVE_FRAME_STATE_FRAME_TYPE:
            {
                LIST_ITEM_HANDLE item_handle;
                frame_codec_data->type_specific_size = (frame_codec_data->receive_frame_doff * 4) - 6;

                /* Codes_SRS_FRAME_CODEC_01_015: [TYPE Byte 5 of the frame header is a type code.] */
                frame_codec_data->receive_frame_type = buffer[0];
                buffer++;
                size--;

                /* Codes_SRS_FRAME_CODEC_01_035: [After successfully registering a callback for a certain frame type, when subsequently that frame type is received the callbacks shall be invoked, passing to it the received frame and the callback_context value.] */
                item_handle = singlylinkedlist_find(frame_codec_data->subscription_list, find_subscription_by_frame_type, &frame_codec_data->receive_frame_type);
                if (item_handle == NULL)
                {
                    frame_codec_data->receive_frame_subscription = NULL;
                    frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_TYPE_SPECIFIC;
                    result = 0;
                    break;
                }
                else
                {
                    frame_codec_data->receive_frame_subscription = (SUBSCRIPTION*)singlylinkedlist_item_get_value(item_handle);
                    if (frame_codec_data->receive_frame_subscription == NULL)
                    {
                        frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_TYPE_SPECIFIC;
                        result = 0;
                        break;
                    }
                    else
                    {
                        frame_codec_data->receive_frame_pos = 0;

                        /* Codes_SRS_FRAME_CODEC_01_102: [frame_codec_receive_bytes shall allocate memory to hold the frame_body bytes.] */
                        frame_codec_data->receive_frame_malloc_size = frame_codec_data->receive_frame_size - 6;
                        frame_codec_data->receive_frame_bytes = (unsigned char*)malloc(frame_codec_data->receive_frame_malloc_size);
                        if (frame_codec_data->receive_frame_bytes == NULL)
                        {
                            /* Codes_SRS_FRAME_CODEC_01_101: [If the memory for the frame_body bytes cannot be allocated, frame_codec_receive_bytes shall fail and return a non-zero value.] */
                            /* Codes_SRS_FRAME_CODEC_01_030: [If a decoding error occurs, frame_codec_data_receive_bytes shall return a non-zero value.] */
                            /* Codes_SRS_FRAME_CODEC_01_074: [If a decoding error is detected, any subsequent calls on frame_codec_data_receive_bytes shall fail.] */
                            frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_ERROR;

                            /* Codes_SRS_FRAME_CODEC_01_103: [Upon any decode error, if an error callback has been passed to frame_codec_create, then the error callback shall be called with the context argument being the on_frame_codec_error_callback_context argument passed to frame_codec_create.] */
                            frame_codec_data->on_frame_codec_error(frame_codec_data->on_frame_codec_error_callback_context);

                            LogError("Cannot allocate memory for frame bytes");
                            result = MU_FAILURE;
                            break;
                        }
                        else
                        {
                            frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_TYPE_SPECIFIC;
                            result = 0;
                            break;
                        }
                    }
                }
            }

            case RECEIVE_FRAME_STATE_TYPE_SPECIFIC:
            {
                size_t to_copy = frame_codec_data->type_specific_size - frame_codec_data->receive_frame_pos;
                if (to_copy > size)
                {
                    to_copy = size;
                }

                if (frame_codec_data->receive_frame_subscription != NULL)
                {
                    // [bug:8781089] WRITE address points to the zero page - SEGV
                    if (frame_codec_data->receive_frame_bytes == NULL)
                    {
                        LogError("Frame bytes memory was not allocated");
                        result = MU_FAILURE;
                        size = 0;
                        break;
                    }
                    else if (frame_codec_data->receive_frame_pos + to_copy > frame_codec_data->receive_frame_malloc_size)
                    {
                        result = MU_FAILURE;
                        size = 0;
                        break;
                    }                    
                    (void)memcpy(&frame_codec_data->receive_frame_bytes[frame_codec_data->receive_frame_pos], buffer, to_copy);
                    frame_codec_data->receive_frame_pos += to_copy;
                    buffer += to_copy;
                    size -= to_copy;
                }
                else
                {
                    frame_codec_data->receive_frame_pos += to_copy;
                    buffer += to_copy;
                    size -= to_copy;
                }

                if (frame_codec_data->receive_frame_pos == frame_codec_data->type_specific_size)
                {
                    if (frame_codec_data->receive_frame_size == FRAME_HEADER_SIZE)
                    {
                        if (frame_codec_data->receive_frame_subscription != NULL)
                        {
                            /* Codes_SRS_FRAME_CODEC_01_031: [When a complete frame is successfully decoded it shall be indicated to the upper layer by invoking the on_frame_received passed to frame_codec_subscribe.] */
                            /* Codes_SRS_FRAME_CODEC_01_032: [Besides passing the frame information, the callback_context value passed to frame_codec_data_subscribe shall be passed to the on_frame_received function.] */
                            /* Codes_SRS_FRAME_CODEC_01_005: [This is an extension point defined for future expansion.] */
                            /* Codes_SRS_FRAME_CODEC_01_006: [The treatment of this area depends on the frame type.] */
                            /* Codes_SRS_FRAME_CODEC_01_100: [If the frame body size is 0, the frame_body pointer passed to on_frame_received shall be NULL.] */
                            frame_codec_data->receive_frame_subscription->on_frame_received(frame_codec_data->receive_frame_subscription->callback_context, frame_codec_data->receive_frame_bytes, frame_codec_data->type_specific_size, NULL, 0);
                            free(frame_codec_data->receive_frame_bytes);
                            frame_codec_data->receive_frame_bytes = NULL;
                        }

                        frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_FRAME_SIZE;
                        frame_codec_data->receive_frame_size = 0;
                    }
                    else
                    {
                        frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_FRAME_BODY;
                    }

                    frame_codec_data->receive_frame_pos = 0;
                }

                result = 0;
                break;
            }

            case RECEIVE_FRAME_STATE_FRAME_BODY:
            {
                uint32_t frame_body_size = frame_codec_data->receive_frame_size - (frame_codec_data->receive_frame_doff * 4);
                size_t to_copy = frame_body_size - frame_codec_data->receive_frame_pos;

                if (to_copy > size)
                {
                    to_copy = size;
                }

                if (frame_codec_data->receive_frame_bytes == NULL)
                {
                    result = MU_FAILURE;
                    size = 0;
                    break;
                }

                (void)memcpy(frame_codec_data->receive_frame_bytes + frame_codec_data->receive_frame_pos + frame_codec_data->type_specific_size, buffer, to_copy);

                buffer += to_copy;
                size -= to_copy;
                frame_codec_data->receive_frame_pos += to_copy;

                if (frame_codec_data->receive_frame_pos == frame_body_size)
                {
                    if (frame_codec_data->receive_frame_subscription != NULL)
                    {
                        /* Codes_SRS_FRAME_CODEC_01_031: [When a complete frame is successfully decoded it shall be indicated to the upper layer by invoking the on_frame_received passed to frame_codec_subscribe.] */
                        /* Codes_SRS_FRAME_CODEC_01_032: [Besides passing the frame information, the callback_context value passed to frame_codec_data_subscribe shall be passed to the on_frame_received function.] */
                        /* Codes_SRS_FRAME_CODEC_01_005: [This is an extension point defined for future expansion.] */
                        /* Codes_SRS_FRAME_CODEC_01_006: [The treatment of this area depends on the frame type.] */
                        /* Codes_SRS_FRAME_CODEC_01_099: [A pointer to the frame_body bytes shall also be passed to the on_frame_received.] */
                        frame_codec_data->receive_frame_subscription->on_frame_received(frame_codec_data->receive_frame_subscription->callback_context, frame_codec_data->receive_frame_bytes, frame_codec_data->type_specific_size, frame_codec_data->receive_frame_bytes + frame_codec_data->type_specific_size, frame_body_size);
                        free(frame_codec_data->receive_frame_bytes);
                        frame_codec_data->receive_frame_bytes = NULL;
                    }

                    frame_codec_data->receive_frame_state = RECEIVE_FRAME_STATE_FRAME_SIZE;
                    frame_codec_data->receive_frame_pos = 0;
                    frame_codec_data->receive_frame_size = 0;
                }
                result = 0;

                break;
            }
            }
        }
    }

    return result;
}